

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

void __thiscall duckdb::Node::InitMerge(Node *this,ART *art,unsafe_vector<idx_t> *upper_bounds)

{
  long *plVar1;
  IndexPointer ptr_p;
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var2;
  idx_t iVar3;
  NType NVar4;
  byte bVar5;
  type paVar6;
  iterator iVar7;
  pointer pFVar8;
  data_ptr_t pdVar9;
  InternalException *pIVar10;
  NType type;
  undefined8 *puVar11;
  idx_t i;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  Node *pNVar15;
  long lVar16;
  Prefix prefix;
  ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node> scanner;
  string local_c8;
  ART *local_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 *local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 *local_70;
  undefined8 *puStack_68;
  undefined8 *local_60;
  long lStack_58;
  string local_50;
  
  local_a0 = 0;
  uStack_98 = 0;
  local_90 = (undefined8 *)0x0;
  uStack_88 = 0;
  local_80 = 0;
  uStack_78 = 0;
  local_70 = (undefined8 *)0x0;
  puStack_68 = (undefined8 *)0x0;
  local_60 = (undefined8 *)0x0;
  lStack_58 = 0;
  local_a8 = art;
  ::std::
  _Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry>_>
  ::_M_initialize_map((_Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry>_>
                       *)&local_a0,0);
  if (local_70 == local_60 + -2) {
    ::std::
    deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
    ::_M_push_back_aux<duckdb::Node&>
              ((deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
                *)&local_a0,this);
  }
  else {
    *local_70 = this;
    *(undefined1 *)(local_70 + 1) = 0;
    local_70 = local_70 + 2;
  }
  if (local_70 != local_90) {
    do {
      puVar11 = local_70;
      if (local_70 == puStack_68) {
        puVar11 = (undefined8 *)(*(long *)(lStack_58 + -8) + 0x200);
      }
      if (*(char *)(puVar11 + -1) == '\x01') {
        plVar1 = (long *)puVar11[-2];
        NVar4 = (NType)((ulong)*plVar1 >> 0x38);
        type = NVar4 & 0x7f;
        if (type != LEAF_INLINED) {
          if ((NVar4 & 0x7f) == LEAF) {
            pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
            local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_c8,"deprecated ART storage in InitMerge","");
            InternalException::InternalException(pIVar10,&local_c8);
            __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
          }
          bVar5 = GetAllocatorIdx(type);
          *plVar1 = *plVar1 + (upper_bounds->
                              super_vector<unsigned_long,_std::allocator<unsigned_long>_>).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start[bVar5];
        }
        if (local_70 == puStack_68) {
          operator_delete(puStack_68);
          puStack_68 = *(undefined8 **)(lStack_58 + -8);
          local_60 = puStack_68 + 0x40;
          local_70 = puStack_68 + 0x3e;
          lStack_58 = lStack_58 + -8;
        }
        else {
          local_70 = local_70 + -2;
        }
      }
      else {
        *(undefined1 *)(puVar11 + -1) = 1;
        ptr_p.data = ((IndexPointer *)puVar11[-2])->data;
        NVar4 = (NType)(ptr_p.data >> 0x38);
        uVar14 = (uint)(ptr_p.data >> 0x20);
        switch(NVar4 & 0x7f) {
        case PREFIX:
          Prefix::Prefix((Prefix *)&local_c8,local_a8,(Node)ptr_p.data,true,false);
          if (local_70 == local_60 + -2) {
            ::std::
            deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
            ::_M_push_back_aux<duckdb::Node&>
                      ((deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
                        *)&local_a0,(Node *)local_c8._M_string_length);
          }
          else {
            *local_70 = local_c8._M_string_length;
            *(undefined1 *)(local_70 + 1) = 0;
            local_70 = local_70 + 2;
          }
          break;
        case LEAF:
        case LEAF_INLINED:
        case NODE_7_LEAF:
        case NODE_15_LEAF:
        case NODE_256_LEAF:
          break;
        case NODE_4:
          paVar6 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                   ::operator*(&local_a8->allocators);
          _Var2._M_head_impl =
               paVar6->_M_elems[2].
               super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
          local_c8._M_dataplus._M_p = (pointer)(ptr_p.data & 0xffffffff);
          iVar7 = ::std::
                  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&((_Var2._M_head_impl)->buffers)._M_h,(key_type *)&local_c8);
          pFVar8 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                   ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                                 *)((long)iVar7.
                                          super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                          ._M_cur + 0x10));
          pdVar9 = FixedSizeBuffer::Get(pFVar8,true);
          lVar13 = (ulong)(uVar14 & 0xffffff) * (_Var2._M_head_impl)->segment_size;
          iVar3 = (_Var2._M_head_impl)->bitmask_offset;
          bVar5 = pdVar9[iVar3 + lVar13];
          if (bVar5 != 0) {
            uVar12 = 0;
            pNVar15 = (Node *)(pdVar9 + iVar3 + lVar13);
            do {
              pNVar15 = pNVar15 + 1;
              if (local_70 == local_60 + -2) {
                ::std::
                deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
                ::_M_push_back_aux<duckdb::Node&>
                          ((deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
                            *)&local_a0,pNVar15);
                bVar5 = (byte)(((Node *)(pdVar9 + iVar3 + lVar13))->super_IndexPointer).data;
              }
              else {
                *local_70 = pNVar15;
                *(undefined1 *)(local_70 + 1) = 0;
                local_70 = local_70 + 2;
              }
              uVar12 = uVar12 + 1;
            } while (uVar12 < bVar5);
          }
          break;
        case NODE_16:
          paVar6 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                   ::operator*(&local_a8->allocators);
          _Var2._M_head_impl =
               paVar6->_M_elems[3].
               super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
          local_c8._M_dataplus._M_p = (pointer)(ptr_p.data & 0xffffffff);
          iVar7 = ::std::
                  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&((_Var2._M_head_impl)->buffers)._M_h,(key_type *)&local_c8);
          pFVar8 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                   ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                                 *)((long)iVar7.
                                          super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                          ._M_cur + 0x10));
          pdVar9 = FixedSizeBuffer::Get(pFVar8,true);
          lVar13 = (ulong)(uVar14 & 0xffffff) * (_Var2._M_head_impl)->segment_size;
          iVar3 = (_Var2._M_head_impl)->bitmask_offset;
          bVar5 = pdVar9[iVar3 + lVar13];
          if (bVar5 != 0) {
            pNVar15 = (Node *)(pdVar9 + iVar3 + lVar13 + 0x18);
            uVar12 = 0;
            do {
              if (local_70 == local_60 + -2) {
                ::std::
                deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
                ::_M_push_back_aux<duckdb::Node&>
                          ((deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
                            *)&local_a0,pNVar15);
                bVar5 = pdVar9[iVar3 + lVar13];
              }
              else {
                *local_70 = pNVar15;
                *(undefined1 *)(local_70 + 1) = 0;
                local_70 = local_70 + 2;
              }
              uVar12 = uVar12 + 1;
              pNVar15 = pNVar15 + 1;
            } while (uVar12 < bVar5);
          }
          break;
        case NODE_48:
          paVar6 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                   ::operator*(&local_a8->allocators);
          _Var2._M_head_impl =
               paVar6->_M_elems[4].
               super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
          local_c8._M_dataplus._M_p = (pointer)(ptr_p.data & 0xffffffff);
          iVar7 = ::std::
                  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&((_Var2._M_head_impl)->buffers)._M_h,(key_type *)&local_c8);
          pFVar8 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                   ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                                 *)((long)iVar7.
                                          super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                          ._M_cur + 0x10));
          pdVar9 = FixedSizeBuffer::Get(pFVar8,true);
          lVar16 = (ulong)(uVar14 & 0xffffff) * (_Var2._M_head_impl)->segment_size;
          iVar3 = (_Var2._M_head_impl)->bitmask_offset;
          lVar13 = 0;
          do {
            if ((ulong)pdVar9[lVar13 + iVar3 + lVar16 + 1] != 0x30) {
              if (local_70 == local_60 + -2) {
                ::std::
                deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
                ::_M_push_back_aux<duckdb::Node&>
                          ((deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
                            *)&local_a0,
                           (Node *)(pdVar9 + (ulong)pdVar9[lVar13 + iVar3 + lVar16 + 1] * 8 +
                                             iVar3 + lVar16 + 0x108));
              }
              else {
                *local_70 = (Node *)(pdVar9 + (ulong)pdVar9[lVar13 + iVar3 + lVar16 + 1] * 8 +
                                              iVar3 + lVar16 + 0x108);
                *(undefined1 *)(local_70 + 1) = 0;
                local_70 = local_70 + 2;
              }
            }
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0x100);
          break;
        case NODE_256:
          paVar6 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
                   ::operator*(&local_a8->allocators);
          _Var2._M_head_impl =
               paVar6->_M_elems[5].
               super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
               .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
          local_c8._M_dataplus._M_p = (pointer)(ptr_p.data & 0xffffffff);
          iVar7 = ::std::
                  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_std::allocator<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&((_Var2._M_head_impl)->buffers)._M_h,(key_type *)&local_c8);
          pFVar8 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                   ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                                 *)((long)iVar7.
                                          super__Node_iterator_base<std::pair<const_unsigned_long,_duckdb::unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>_>,_false>
                                          ._M_cur + 0x10));
          pdVar9 = FixedSizeBuffer::Get(pFVar8,true);
          lVar13 = (_Var2._M_head_impl)->bitmask_offset +
                   (ulong)(uVar14 & 0xffffff) * (_Var2._M_head_impl)->segment_size;
          lVar16 = 0;
          do {
            if (pdVar9[lVar16 + lVar13 + 0xf] != '\0') {
              if (local_70 == local_60 + -2) {
                ::std::
                deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
                ::_M_push_back_aux<duckdb::Node&>
                          ((deque<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry,std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,duckdb::Node>::NodeEntry>>
                            *)&local_a0,(Node *)(pdVar9 + lVar16 + lVar13 + 8));
              }
              else {
                *local_70 = (Node *)(pdVar9 + lVar16 + lVar13 + 8);
                *(undefined1 *)(local_70 + 1) = 0;
                local_70 = local_70 + 2;
              }
            }
            lVar16 = lVar16 + 8;
          } while (lVar16 != 0x800);
          break;
        default:
          pIVar10 = (InternalException *)__cxa_allocate_exception(0x10);
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8,"invalid node type for ART ScanHandleLast: %s","");
          EnumUtil::ToString<duckdb::NType>(&local_50,NVar4 & 0x7f);
          InternalException::InternalException<std::__cxx11::string>(pIVar10,&local_c8,&local_50);
          __cxa_throw(pIVar10,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
      }
    } while (local_70 != local_90);
  }
  ::std::
  _Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry>_>
  ::~_Deque_base((_Deque_base<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry,_std::allocator<duckdb::ARTScanner<(duckdb::ARTScanHandling)1,_duckdb::Node>::NodeEntry>_>
                  *)&local_a0);
  return;
}

Assistant:

void Node::InitMerge(ART &art, const unsafe_vector<idx_t> &upper_bounds) {
	D_ASSERT(HasMetadata());
	ARTScanner<ARTScanHandling::POP, Node> scanner(art);

	auto handler = [&upper_bounds](Node &node) {
		const auto type = node.GetType();
		if (node.GetType() == NType::LEAF_INLINED) {
			return ARTScanHandlingResult::CONTINUE;
		}
		if (type == NType::LEAF) {
			throw InternalException("deprecated ART storage in InitMerge");
		}
		const auto idx = GetAllocatorIdx(type);
		node.IncreaseBufferId(upper_bounds[idx]);
		return ARTScanHandlingResult::CONTINUE;
	};

	scanner.Init(handler, *this);
	scanner.Scan(handler);
}